

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilter.cpp
# Opt level: O0

SimpleString __thiscall TestFilter::asString(TestFilter *this)

{
  char *pcVar1;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t extraout_RDX_01;
  SimpleString *in_RSI;
  SimpleString SVar3;
  TestFilter *this_local;
  SimpleString *textFilter;
  size_t sVar2;
  
  pcVar1 = SimpleString::asCharString(in_RSI);
  SVar3 = StringFromFormat((char *)this,"TestFilter: \"%s\"",pcVar1);
  sVar2 = SVar3.bufferSize_;
  if ((((ulong)in_RSI[1].buffer_ & 1) == 0) || (((ulong)in_RSI[1].buffer_ & 0x100) == 0)) {
    if (((ulong)in_RSI[1].buffer_ & 1) == 0) {
      if (((ulong)in_RSI[1].buffer_ & 0x100) != 0) {
        SimpleString::operator+=(&this->filter_," with invert matching");
        sVar2 = extraout_RDX_01;
      }
    }
    else {
      SimpleString::operator+=(&this->filter_," with strict matching");
      sVar2 = extraout_RDX_00;
    }
  }
  else {
    SimpleString::operator+=(&this->filter_," with strict, invert matching");
    sVar2 = extraout_RDX;
  }
  SVar3.bufferSize_ = sVar2;
  SVar3.buffer_ = (char *)this;
  return SVar3;
}

Assistant:

SimpleString TestFilter::asString() const
{
    SimpleString textFilter =  StringFromFormat("TestFilter: \"%s\"", filter_.asCharString());
    if (strictMatching_ && invertMatching_)
        textFilter += " with strict, invert matching";
    else if (strictMatching_)
        textFilter += " with strict matching";
    else if (invertMatching_)
        textFilter += " with invert matching";

    return textFilter;
}